

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionTest_GetRepeatedStringViewWithExtensions_Test::
~GeneratedMessageReflectionTest_GetRepeatedStringViewWithExtensions_Test
          (GeneratedMessageReflectionTest_GetRepeatedStringViewWithExtensions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetRepeatedStringViewWithExtensions) {
  unittest::TestAllExtensions message;
  google::protobuf::FileDescriptor const* descriptor_file =
      message.GetDescriptor()->file();
  google::protobuf::FieldDescriptor const* string_ext =
      descriptor_file->FindExtensionByName("repeated_string_extension");
  google::protobuf::FieldDescriptor const* string_piece_ext =
      descriptor_file->FindExtensionByName("repeated_string_piece_extension");
  google::protobuf::FieldDescriptor const* cord_ext =
      descriptor_file->FindExtensionByName("repeated_cord_extension");
  message.AddExtension(proto2_unittest::repeated_string_extension, "foo");
  message.AddExtension(proto2_unittest::repeated_string_piece_extension, "bar");
  message.AddExtension(proto2_unittest::repeated_cord_extension, "baz");
  const Reflection* reflection = message.GetReflection();
  Reflection::ScratchSpace scratch;

  EXPECT_EQ("foo",
            reflection->GetRepeatedStringView(message, string_ext, 0, scratch));
  EXPECT_EQ("bar", reflection->GetRepeatedStringView(message, string_piece_ext,
                                                     0, scratch));
  EXPECT_EQ("baz",
            reflection->GetRepeatedStringView(message, cord_ext, 0, scratch));
}